

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * Extra_bddTuples(DdManager *dd,int K,DdNode *VarsN)

{
  int iVar1;
  bool bVar2;
  DdNode *in_RAX;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  
  iVar1 = dd->autoDyn;
  dd->autoDyn = 0;
  do {
    pDVar5 = dd->one;
    iVar3 = 0;
    if (pDVar5 != VarsN) {
      iVar3 = 0;
      pDVar6 = VarsN;
      do {
        if ((pDVar6->type).kids.E != (DdNode *)((ulong)pDVar5 ^ 1)) goto LAB_00817882;
        iVar3 = iVar3 + 1;
        pDVar6 = (pDVar6->type).kids.T;
      } while (pDVar6 != pDVar5);
    }
    iVar4 = iVar3 - K;
    if (iVar3 < K) {
LAB_00817882:
      bVar2 = false;
    }
    else {
      pDVar5 = VarsN;
      if (iVar4 != 0 && K <= iVar3) {
        do {
          pDVar5 = (pDVar5->type).kids.T;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      dd->reordered = 0;
      in_RAX = extraBddTuples(dd,pDVar5,VarsN);
      bVar2 = true;
    }
    if (!bVar2) {
      return (DdNode *)0x0;
    }
    if (dd->reordered != 1) {
      dd->autoDyn = iVar1;
      return in_RAX;
    }
  } while( true );
}

Assistant:

DdNode * Extra_bddTuples( 
  DdManager * dd,   /* the DD manager */
  int K,            /* the number of variables in tuples */
  DdNode * VarsN)   /* the set of all variables represented as a BDD */
{
    DdNode  *res;
    int     autoDyn;

    /* it is important that reordering does not happen, 
       otherwise, this methods will not work */

    autoDyn = dd->autoDyn;
    dd->autoDyn = 0;

    do {
        /* transform the numeric arguments (K) into a DdNode * argument;
         * this allows us to use the standard internal CUDD cache */
        DdNode *VarSet = VarsN, *VarsK = VarsN;
        int     nVars = 0, i;

        /* determine the number of variables in VarSet */
        while ( VarSet != b1 )
        {
            nVars++;
            /* make sure that the VarSet is a cube */
            if ( cuddE( VarSet ) != b0 )
                return NULL;
            VarSet = cuddT( VarSet );
        }
        /* make sure that the number of variables in VarSet is less or equal 
           that the number of variables that should be present in the tuples
        */
        if ( K > nVars )
            return NULL;

        /* the second argument in the recursive call stands for <n>;
         * create the first argument, which stands for <k> 
         * as when we are talking about the tuple of <k> out of <n> */
        for ( i = 0; i < nVars-K; i++ )
            VarsK = cuddT( VarsK );

        dd->reordered = 0;
        res = extraBddTuples(dd, VarsK, VarsN );

    } while (dd->reordered == 1);
    dd->autoDyn = autoDyn;
    return(res);

}